

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf_impl.cpp
# Opt level: O0

int32_t utf8_back1SafeBody_63(uint8_t *s,int32_t start,int32_t i)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int32_t iVar4;
  uint8_t b3;
  uint8_t b2;
  uint8_t b1;
  uint8_t c;
  int32_t orig_i;
  int32_t i_local;
  int32_t start_local;
  uint8_t *s_local;
  
  bVar1 = s[i];
  if (-0x41 < (char)bVar1) {
    return i;
  }
  if (i <= start) {
    return i;
  }
  iVar4 = i + -1;
  bVar2 = s[iVar4];
  if ((byte)(bVar2 + 0x3e) < 0x33) {
    if (bVar2 < 0xe0) {
      return iVar4;
    }
    if (bVar2 < 0xf0) {
      uVar3 = (int)" 000000000000\x1000"[(int)(bVar2 & 0xf)] & 1 << (sbyte)((int)(uint)bVar1 >> 5);
    }
    else {
      uVar3 = (int)""[(int)(uint)bVar1 >> 4] & 1 << (bVar2 & 7);
    }
  }
  else {
    if (-0x41 < (char)bVar2) {
      return i;
    }
    if (iVar4 <= start) {
      return i;
    }
    iVar4 = i + -2;
    bVar1 = s[iVar4];
    if ((bVar1 < 0xe0) || (0xf4 < bVar1)) {
      if (-0x41 < (char)bVar1) {
        return i;
      }
      if (iVar4 <= start) {
        return i;
      }
      iVar4 = i + -3;
      bVar2 = s[iVar4];
      if (bVar2 < 0xf0) {
        return i;
      }
      if (0xf4 < bVar2) {
        return i;
      }
      uVar3 = (int)""[(int)(uint)bVar1 >> 4] & 1 << (bVar2 & 7);
    }
    else if (bVar1 < 0xf0) {
      uVar3 = (int)" 000000000000\x1000"[(int)(bVar1 & 0xf)] & 1 << (sbyte)((int)(uint)bVar2 >> 5);
    }
    else {
      uVar3 = (int)""[(int)(uint)bVar2 >> 4] & 1 << (bVar1 & 7);
    }
  }
  if (uVar3 == 0) {
    return i;
  }
  return iVar4;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utf8_back1SafeBody(const uint8_t *s, int32_t start, int32_t i) {
    // Same as utf8_prevCharSafeBody(..., strict=-1) minus assembling code points.
    int32_t orig_i=i;
    uint8_t c=s[i];
    if(U8_IS_TRAIL(c) && i>start) {
        uint8_t b1=s[--i];
        if(U8_IS_LEAD(b1)) {
            if(b1<0xe0 ||
                    (b1<0xf0 ? U8_IS_VALID_LEAD3_AND_T1(b1, c) : U8_IS_VALID_LEAD4_AND_T1(b1, c))) {
                return i;
            }
        } else if(U8_IS_TRAIL(b1) && i>start) {
            uint8_t b2=s[--i];
            if(0xe0<=b2 && b2<=0xf4) {
                if(b2<0xf0 ? U8_IS_VALID_LEAD3_AND_T1(b2, b1) : U8_IS_VALID_LEAD4_AND_T1(b2, b1)) {
                    return i;
                }
            } else if(U8_IS_TRAIL(b2) && i>start) {
                uint8_t b3=s[--i];
                if(0xf0<=b3 && b3<=0xf4 && U8_IS_VALID_LEAD4_AND_T1(b3, b2)) {
                    return i;
                }
            }
        }
    }
    return orig_i;
}